

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportTryCompileFileGenerator::PopulateProperties
          (cmExportTryCompileFileGenerator *this,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  pointer pbVar1;
  bool bVar2;
  cmValue cVar3;
  mapped_type *pmVar4;
  cmLocalGenerator *this_00;
  string *li;
  pointer name;
  pointer prop;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  string_view str;
  string_view str_00;
  string_view str_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  cmGeneratorTarget *tgt;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  cmList depends;
  string evalResult;
  
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&props,target);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[25]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
             (char (*) [25])"INTERFACE_LINK_LIBRARIES");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[32]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
             (char (*) [32])"INTERFACE_LINK_LIBRARIES_DIRECT");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[40]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
             (char (*) [40])"INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE");
  prop = props.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (prop == props.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&props);
      return;
    }
    cVar3 = cmGeneratorTarget::GetProperty(target,prop);
    if (cVar3.Value != (string *)0x0) {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,prop);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      str._M_str = (prop->_M_dataplus)._M_p;
      str._M_len = prop->_M_string_length;
      bVar2 = cmHasLiteralPrefix<34ul>(str,(char (*) [34])"IMPORTED_LINK_INTERFACE_LIBRARIES");
      if (!bVar2) {
        str_00._M_str = (prop->_M_dataplus)._M_p;
        str_00._M_len = prop->_M_string_length;
        bVar2 = cmHasLiteralPrefix<34ul>(str_00,(char (*) [34])"IMPORTED_LINK_DEPENDENT_LIBRARIES");
        if (!bVar2) {
          str_01._M_str = (prop->_M_dataplus)._M_p;
          str_01._M_len = prop->_M_string_length;
          bVar2 = cmHasLiteralPrefix<25ul>(str_01,(char (*) [25])"INTERFACE_LINK_LIBRARIES");
          if (!bVar2) goto LAB_0058ca9e;
        }
      }
      tgt = (cmGeneratorTarget *)&local_78;
      local_80 = 0;
      local_78._M_local_buf[0] = '\0';
      FindTargets(&evalResult,this,prop,target,(string *)&tgt,emitted);
      std::__cxx11::string::~string((string *)&tgt);
      std::__cxx11::string::string((string *)&tgt,(string *)&evalResult);
      init._M_len = 1;
      init._M_array = (string *)&tgt;
      cmList::cmList(&depends,init);
      std::__cxx11::string::~string((string *)&tgt);
      pbVar1 = depends.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (name = depends.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; name != pbVar1; name = name + 1) {
        this_00 = cmGeneratorTarget::GetLocalGenerator(target);
        tgt = cmLocalGenerator::FindGeneratorTargetToUse(this_00,name);
        if (tgt != (cmGeneratorTarget *)0x0) {
          pVar5 = std::
                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  ::_M_insert_unique<cmGeneratorTarget_const*const&>
                            ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                              *)emitted,&tgt);
          if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            push_back(&this->Exports,(value_type *)&tgt);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends.Values);
      std::__cxx11::string::~string((string *)&evalResult);
    }
LAB_0058ca9e:
    prop = prop + 1;
  } while( true );
}

Assistant:

void cmExportTryCompileFileGenerator::PopulateProperties(
  const cmGeneratorTarget* target, ImportPropertyMap& properties,
  std::set<cmGeneratorTarget const*>& emitted)
{
  // Look through all non-special properties.
  std::vector<std::string> props = target->GetPropertyKeys();
  // Include special properties that might be relevant here.
  props.emplace_back("INTERFACE_LINK_LIBRARIES");
  props.emplace_back("INTERFACE_LINK_LIBRARIES_DIRECT");
  props.emplace_back("INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE");
  for (std::string const& p : props) {
    cmValue v = target->GetProperty(p);
    if (!v) {
      continue;
    }
    properties[p] = *v;

    if (cmHasLiteralPrefix(p, "IMPORTED_LINK_INTERFACE_LIBRARIES") ||
        cmHasLiteralPrefix(p, "IMPORTED_LINK_DEPENDENT_LIBRARIES") ||
        cmHasLiteralPrefix(p, "INTERFACE_LINK_LIBRARIES")) {
      std::string evalResult =
        this->FindTargets(p, target, std::string(), emitted);

      cmList depends{ evalResult };
      for (std::string const& li : depends) {
        cmGeneratorTarget* tgt =
          target->GetLocalGenerator()->FindGeneratorTargetToUse(li);
        if (tgt && emitted.insert(tgt).second) {
          this->Exports.push_back(tgt);
        }
      }
    }
  }
}